

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O2

_Bool Curl_pipeline_server_blacklisted(SessionHandle *handle,char *server_name)

{
  curl_llist_element *pcVar1;
  char *__s;
  int iVar2;
  curl_llist *pcVar3;
  size_t max;
  bool bVar4;
  char *fmt;
  
  if (handle->multi == (Curl_multi *)0x0) {
    bVar4 = false;
  }
  else {
    pcVar3 = Curl_multi_pipelining_server_bl(handle->multi);
    fmt = "Server %s is not blacklisted\n";
    if (pcVar3 == (curl_llist *)0x0) {
      bVar4 = false;
    }
    else {
      do {
        pcVar1 = pcVar3->head;
        bVar4 = pcVar1 != (curl_llist_element *)0x0;
        if (pcVar1 == (curl_llist_element *)0x0) goto LAB_0010ce8e;
        __s = (char *)pcVar1->ptr;
        max = strlen(__s);
        iVar2 = Curl_raw_nequal(__s,server_name,max);
        pcVar3 = (curl_llist *)&pcVar1->next;
      } while (iVar2 == 0);
      fmt = "Server %s is blacklisted\n";
    }
LAB_0010ce8e:
    Curl_infof(handle,fmt,server_name);
  }
  return bVar4;
}

Assistant:

bool Curl_pipeline_server_blacklisted(struct SessionHandle *handle,
                                      char *server_name)
{
  if(handle->multi) {
    struct curl_llist *blacklist =
      Curl_multi_pipelining_server_bl(handle->multi);

    if(blacklist) {
      struct curl_llist_element *curr;

      curr = blacklist->head;
      while(curr) {
        char *bl_server_name;

        bl_server_name = curr->ptr;
        if(Curl_raw_nequal(bl_server_name, server_name,
                           strlen(bl_server_name))) {
          infof(handle, "Server %s is blacklisted\n", server_name);
          return TRUE;
        }
        curr = curr->next;
      }
    }

    infof(handle, "Server %s is not blacklisted\n", server_name);
  }
  return FALSE;
}